

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inffast.c
# Opt level: O2

void inflate_fast(z_streamp strm,uint start)

{
  byte *pbVar1;
  byte *pbVar2;
  Bytef *pBVar3;
  internal_state iVar4;
  internal_state iVar5;
  byte bVar6;
  byte bVar7;
  ushort uVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  internal_state *piVar12;
  long lVar13;
  long lVar14;
  uint uVar15;
  uint uVar16;
  Bytef *pBVar17;
  undefined4 uVar18;
  long lVar19;
  char *pcVar20;
  uint uVar21;
  ulong uVar22;
  Bytef *pBVar23;
  long lVar24;
  ulong uVar25;
  ulong uVar26;
  int iVar27;
  Bytef *pBVar28;
  long lVar29;
  ulong uVar30;
  uint uVar31;
  uint uVar32;
  Bytef *pBVar33;
  int local_48;
  
  piVar12 = strm->state;
  pBVar33 = strm->next_in + ((ulong)(strm->avail_in - 5) - 1);
  pBVar23 = strm->next_in + -1;
  pBVar28 = strm->next_out + -1;
  local_48 = (int)pBVar28 - (start - strm->avail_out);
  pBVar17 = strm->next_out + ((ulong)(strm->avail_out - 0x101) - 1);
  iVar9 = *(int *)(piVar12 + 0x34);
  uVar10 = *(uint *)(piVar12 + 0x38);
  uVar11 = *(uint *)(piVar12 + 0x3c);
  lVar24 = *(long *)(piVar12 + 0x40);
  iVar4 = piVar12[0x70];
  uVar26 = *(ulong *)(piVar12 + 0x48);
  iVar5 = piVar12[0x74];
  uVar15 = *(uint *)(piVar12 + 0x50);
  lVar13 = *(long *)(piVar12 + 0x60);
  lVar14 = *(long *)(piVar12 + 0x68);
LAB_0011ad36:
  if (uVar15 < 0xf) {
    pbVar1 = pBVar23 + 1;
    pbVar2 = pBVar23 + 2;
    pBVar23 = pBVar23 + 2;
    uVar26 = ((ulong)*pbVar2 << ((byte)uVar15 + 8 & 0x3f)) +
             ((ulong)*pbVar1 << ((byte)uVar15 & 0x3f)) + uVar26;
    uVar15 = uVar15 | 0x10;
  }
  uVar25 = (ulong)((uint)uVar26 & ~(-1 << ((byte)iVar4 & 0x1f)));
  while( true ) {
    bVar6 = *(byte *)(lVar13 + 1 + uVar25 * 4);
    uVar26 = uVar26 >> (bVar6 & 0x3f);
    bVar7 = *(byte *)(lVar13 + uVar25 * 4);
    uVar15 = uVar15 - bVar6;
    uVar8 = *(ushort *)(lVar13 + 2 + uVar25 * 4);
    uVar25 = (ulong)uVar8;
    if (bVar7 == 0) break;
    if ((bVar7 & 0x10) != 0) {
      uVar21 = bVar7 & 0xf;
      if ((bVar7 & 0xf) != 0) {
        if (uVar15 < uVar21) {
          pbVar1 = pBVar23 + 1;
          pBVar23 = pBVar23 + 1;
          uVar26 = uVar26 + ((ulong)*pbVar1 << ((byte)uVar15 & 0x3f));
          uVar15 = uVar15 + 8;
        }
        uVar16 = (uint)uVar26;
        uVar26 = uVar26 >> (sbyte)uVar21;
        uVar15 = uVar15 - uVar21;
        uVar25 = (ulong)((~(-1 << (sbyte)uVar21) & uVar16) + (uint)uVar8);
      }
      if (uVar15 < 0xf) {
        pbVar1 = pBVar23 + 1;
        pbVar2 = pBVar23 + 2;
        pBVar23 = pBVar23 + 2;
        uVar26 = ((ulong)*pbVar2 << ((byte)uVar15 + 8 & 0x3f)) +
                 ((ulong)*pbVar1 << ((byte)uVar15 & 0x3f)) + uVar26;
        uVar15 = uVar15 | 0x10;
      }
      uVar30 = (ulong)((uint)uVar26 & ~(-1 << ((byte)iVar5 & 0x1f)));
      goto LAB_0011ae1a;
    }
    if ((bVar7 & 0x40) != 0) {
      if ((bVar7 & 0x20) != 0) {
        uVar18 = 0xb;
        goto LAB_0011b133;
      }
      pcVar20 = "invalid literal/length code";
      goto LAB_0011b123;
    }
    uVar25 = (~(-1 << (bVar7 & 0x1f)) & (uint)uVar26) + uVar25;
  }
  pBVar28[1] = (Bytef)uVar8;
  pBVar28 = pBVar28 + 1;
  goto LAB_0011b0d0;
LAB_0011ae1a:
  bVar6 = *(byte *)(lVar14 + 1 + uVar30 * 4);
  uVar26 = uVar26 >> (bVar6 & 0x3f);
  bVar7 = *(byte *)(lVar14 + uVar30 * 4);
  uVar8 = *(ushort *)(lVar14 + 2 + uVar30 * 4);
  uVar15 = uVar15 - bVar6;
  if ((bVar7 & 0x10) != 0) goto LAB_0011ae55;
  if ((bVar7 & 0x40) != 0) {
    pcVar20 = "invalid distance code";
    goto LAB_0011b123;
  }
  uVar30 = (ulong)(~(-1 << (bVar7 & 0x1f)) & (uint)uVar26) + (ulong)uVar8;
  goto LAB_0011ae1a;
LAB_0011ae55:
  uVar21 = bVar7 & 0xf;
  if (uVar15 < uVar21) {
    uVar26 = ((ulong)pBVar23[1] << ((byte)uVar15 & 0x3f)) + uVar26;
    uVar16 = uVar15 + 8;
    if (uVar16 < uVar21) {
      pbVar1 = pBVar23 + 2;
      pBVar23 = pBVar23 + 2;
      uVar26 = uVar26 + ((ulong)*pbVar1 << ((byte)uVar16 & 0x3f));
      uVar15 = uVar15 + 0x10;
    }
    else {
      pBVar23 = pBVar23 + 1;
      uVar15 = uVar16;
    }
  }
  uVar31 = (~(-1 << (sbyte)uVar21) & (uint)uVar26) + (uint)uVar8;
  uVar26 = uVar26 >> (sbyte)uVar21;
  uVar15 = uVar15 - uVar21;
  uVar21 = (int)pBVar28 - local_48;
  uVar30 = (ulong)uVar31;
  uVar32 = uVar31 - uVar21;
  uVar16 = (uint)uVar25;
  if (uVar31 < uVar21 || uVar32 == 0) {
    lVar29 = 0;
    do {
      lVar19 = lVar29;
      pBVar28[lVar19 + 1] = pBVar28[lVar19 + (1 - uVar30)];
      pBVar28[lVar19 + 2] = pBVar28[lVar19 + (2 - uVar30)];
      pBVar28[lVar19 + 3] = pBVar28[lVar19 + (3 - uVar30)];
      uVar21 = (int)uVar25 - 3;
      uVar25 = (ulong)uVar21;
      lVar29 = lVar19 + 3;
    } while (2 < uVar21);
    if ((uint)lVar29 == uVar16) {
      pBVar28 = pBVar28 + lVar29;
    }
    else {
      pBVar28[lVar19 + 4] = pBVar28[-uVar30 + 1 + lVar29];
      if ((uint)lVar29 - uVar16 == -2) {
        pBVar3 = pBVar28 + -uVar30 + 2 + lVar29;
        pBVar28 = pBVar28 + lVar19 + 5;
        *pBVar28 = *pBVar3;
      }
      else {
        pBVar28 = pBVar28 + lVar19 + 4;
      }
    }
    goto LAB_0011b0d0;
  }
  if ((uVar10 < uVar32) && (*(int *)(piVar12 + 0x1be0) != 0)) {
    pcVar20 = "invalid distance too far back";
LAB_0011b123:
    strm->msg = pcVar20;
    uVar18 = 0x1d;
LAB_0011b133:
    *(undefined4 *)piVar12 = uVar18;
LAB_0011b137:
    lVar24 = (long)pBVar23 - (ulong)(uVar15 >> 3);
    strm->next_in = (Bytef *)(lVar24 + 1);
    strm->next_out = pBVar28 + 1;
    strm->avail_in = ((int)pBVar33 - (int)lVar24) + 5;
    strm->avail_out = ((int)pBVar17 - (int)pBVar28) + 0x101;
    *(ulong *)(piVar12 + 0x48) = (ulong)((uint)uVar26 & ~(-1 << (sbyte)(uVar15 & 7)));
    *(uint *)(piVar12 + 0x50) = uVar15 & 7;
    return;
  }
  if (uVar11 == 0) {
    uVar22 = (ulong)(iVar9 - uVar32);
    uVar21 = uVar16 - uVar32;
    if (uVar16 < uVar32 || uVar21 == 0) goto LAB_0011b04f;
    lVar29 = 0;
    do {
      pBVar28[1] = *(Bytef *)(uVar22 + lVar24 + lVar29);
      pBVar28 = pBVar28 + 1;
      lVar29 = lVar29 + 1;
    } while (uVar32 != (uint)lVar29);
LAB_0011b044:
    lVar29 = (long)pBVar28 - uVar30;
    uVar25 = (ulong)uVar21;
  }
  else {
    if (uVar11 < uVar32) {
      uVar22 = (ulong)((uVar11 + iVar9) - uVar32);
      uVar32 = uVar32 - uVar11;
      uVar21 = uVar16 - uVar32;
      if (uVar32 <= uVar16 && uVar21 != 0) {
        lVar29 = 0;
        do {
          pBVar28[lVar29 + 1] = *(Bytef *)(uVar22 + lVar24 + lVar29);
          lVar29 = lVar29 + 1;
        } while (uVar32 != (uint)lVar29);
        pBVar28 = pBVar28 + lVar29;
        if (uVar11 < uVar21) {
          lVar29 = 0;
          do {
            pBVar28[1] = *(Bytef *)(lVar24 + lVar29);
            pBVar28 = pBVar28 + 1;
            lVar29 = lVar29 + 1;
          } while (uVar11 != (uint)lVar29);
          uVar25 = (ulong)(uVar21 - uVar11);
          lVar29 = (long)pBVar28 - uVar30;
        }
        else {
          uVar25 = (ulong)uVar21;
          lVar29 = lVar24 + -1;
        }
        goto LAB_0011b059;
      }
    }
    else {
      uVar22 = (ulong)(uVar11 - uVar32);
      uVar21 = uVar16 - uVar32;
      if (uVar32 <= uVar16 && uVar21 != 0) {
        lVar29 = 0;
        do {
          pBVar28[1] = *(Bytef *)(uVar22 + lVar24 + lVar29);
          pBVar28 = pBVar28 + 1;
          lVar29 = lVar29 + 1;
        } while (uVar32 != (uint)lVar29);
        goto LAB_0011b044;
      }
    }
LAB_0011b04f:
    lVar29 = uVar22 + lVar24 + -1;
  }
LAB_0011b059:
  lVar19 = 0;
  iVar27 = (int)uVar25;
  for (; 2 < (uint)uVar25; uVar25 = (ulong)((uint)uVar25 - 3)) {
    pBVar28[lVar19 + 1] = *(Bytef *)(lVar29 + 1 + lVar19);
    pBVar28[lVar19 + 2] = *(Bytef *)(lVar29 + 2 + lVar19);
    pBVar28[lVar19 + 3] = *(Bytef *)(lVar29 + 3 + lVar19);
    lVar19 = lVar19 + 3;
  }
  if ((int)lVar19 == iVar27) {
    pBVar28 = pBVar28 + lVar19;
  }
  else {
    pBVar28[lVar19 + 1] = *(Bytef *)(lVar29 + 1 + lVar19);
    if ((int)lVar19 - iVar27 == -2) {
      pBVar28 = pBVar28 + lVar19 + 2;
      *pBVar28 = *(Bytef *)(lVar29 + 2 + lVar19);
    }
    else {
      pBVar28 = pBVar28 + lVar19 + 1;
    }
  }
LAB_0011b0d0:
  if ((pBVar33 <= pBVar23) || (pBVar17 <= pBVar28)) goto LAB_0011b137;
  goto LAB_0011ad36;
}

Assistant:

void ZLIB_INTERNAL inflate_fast(strm, start)
z_streamp strm;
unsigned start;         /* inflate()'s starting value for strm->avail_out */
{
    struct inflate_state FAR *state;
    unsigned char FAR *in;      /* local strm->next_in */
    unsigned char FAR *last;    /* while in < last, enough input available */
    unsigned char FAR *out;     /* local strm->next_out */
    unsigned char FAR *beg;     /* inflate()'s initial strm->next_out */
    unsigned char FAR *end;     /* while out < end, enough space available */
#ifdef INFLATE_STRICT
    unsigned dmax;              /* maximum distance from zlib header */
#endif
    unsigned wsize;             /* window size or zero if not using window */
    unsigned whave;             /* valid bytes in the window */
    unsigned wnext;             /* window write index */
    unsigned char FAR *window;  /* allocated sliding window, if wsize != 0 */
    unsigned long hold;         /* local strm->hold */
    unsigned bits;              /* local strm->bits */
    code const FAR *lcode;      /* local strm->lencode */
    code const FAR *dcode;      /* local strm->distcode */
    unsigned lmask;             /* mask for first level of length codes */
    unsigned dmask;             /* mask for first level of distance codes */
    code here;                  /* retrieved table entry */
    unsigned op;                /* code bits, operation, extra bits, or */
                                /*  window position, window bytes to copy */
    unsigned len;               /* match length, unused bytes */
    unsigned dist;              /* match distance */
    unsigned char FAR *from;    /* where to copy match from */

    /* copy state to local variables */
    state = (struct inflate_state FAR *)strm->state;
    in = strm->next_in - OFF;
    last = in + (strm->avail_in - 5);
    out = strm->next_out - OFF;
    beg = out - (start - strm->avail_out);
    end = out + (strm->avail_out - 257);
#ifdef INFLATE_STRICT
    dmax = state->dmax;
#endif
    wsize = state->wsize;
    whave = state->whave;
    wnext = state->wnext;
    window = state->window;
    hold = state->hold;
    bits = state->bits;
    lcode = state->lencode;
    dcode = state->distcode;
    lmask = (1U << state->lenbits) - 1;
    dmask = (1U << state->distbits) - 1;

    /* decode literals and length/distances until end-of-block or not enough
       input data or output space */
    do {
        if (bits < 15) {
            hold += (unsigned long)(PUP(in)) << bits;
            bits += 8;
            hold += (unsigned long)(PUP(in)) << bits;
            bits += 8;
        }
        here = lcode[hold & lmask];
      dolen:
        op = (unsigned)(here.bits);
        hold >>= op;
        bits -= op;
        op = (unsigned)(here.op);
        if (op == 0) {                          /* literal */
            Tracevv((stderr, here.val >= 0x20 && here.val < 0x7f ?
                    "inflate:         literal '%c'\n" :
                    "inflate:         literal 0x%02x\n", here.val));
            PUP(out) = (unsigned char)(here.val);
        }
        else if (op & 16) {                     /* length base */
            len = (unsigned)(here.val);
            op &= 15;                           /* number of extra bits */
            if (op) {
                if (bits < op) {
                    hold += (unsigned long)(PUP(in)) << bits;
                    bits += 8;
                }
                len += (unsigned)hold & ((1U << op) - 1);
                hold >>= op;
                bits -= op;
            }
            Tracevv((stderr, "inflate:         length %u\n", len));
            if (bits < 15) {
                hold += (unsigned long)(PUP(in)) << bits;
                bits += 8;
                hold += (unsigned long)(PUP(in)) << bits;
                bits += 8;
            }
            here = dcode[hold & dmask];
          dodist:
            op = (unsigned)(here.bits);
            hold >>= op;
            bits -= op;
            op = (unsigned)(here.op);
            if (op & 16) {                      /* distance base */
                dist = (unsigned)(here.val);
                op &= 15;                       /* number of extra bits */
                if (bits < op) {
                    hold += (unsigned long)(PUP(in)) << bits;
                    bits += 8;
                    if (bits < op) {
                        hold += (unsigned long)(PUP(in)) << bits;
                        bits += 8;
                    }
                }
                dist += (unsigned)hold & ((1U << op) - 1);
#ifdef INFLATE_STRICT
                if (dist > dmax) {
                    strm->msg = (char *)"invalid distance too far back";
                    state->mode = BAD;
                    break;
                }
#endif
                hold >>= op;
                bits -= op;
                Tracevv((stderr, "inflate:         distance %u\n", dist));
                op = (unsigned)(out - beg);     /* max distance in output */
                if (dist > op) {                /* see if copy from window */
                    op = dist - op;             /* distance back in window */
                    if (op > whave) {
                        if (state->sane) {
                            strm->msg =
                                (char *)"invalid distance too far back";
                            state->mode = BAD;
                            break;
                        }
#ifdef INFLATE_ALLOW_INVALID_DISTANCE_TOOFAR_ARRR
                        if (len <= op - whave) {
                            do {
                                PUP(out) = 0;
                            } while (--len);
                            continue;
                        }
                        len -= op - whave;
                        do {
                            PUP(out) = 0;
                        } while (--op > whave);
                        if (op == 0) {
                            from = out - dist;
                            do {
                                PUP(out) = PUP(from);
                            } while (--len);
                            continue;
                        }
#endif
                    }
                    from = window - OFF;
                    if (wnext == 0) {           /* very common case */
                        from += wsize - op;
                        if (op < len) {         /* some from window */
                            len -= op;
                            do {
                                PUP(out) = PUP(from);
                            } while (--op);
                            from = out - dist;  /* rest from output */
                        }
                    }
                    else if (wnext < op) {      /* wrap around window */
                        from += wsize + wnext - op;
                        op -= wnext;
                        if (op < len) {         /* some from end of window */
                            len -= op;
                            do {
                                PUP(out) = PUP(from);
                            } while (--op);
                            from = window - OFF;
                            if (wnext < len) {  /* some from start of window */
                                op = wnext;
                                len -= op;
                                do {
                                    PUP(out) = PUP(from);
                                } while (--op);
                                from = out - dist;      /* rest from output */
                            }
                        }
                    }
                    else {                      /* contiguous in window */
                        from += wnext - op;
                        if (op < len) {         /* some from window */
                            len -= op;
                            do {
                                PUP(out) = PUP(from);
                            } while (--op);
                            from = out - dist;  /* rest from output */
                        }
                    }
                    while (len > 2) {
                        PUP(out) = PUP(from);
                        PUP(out) = PUP(from);
                        PUP(out) = PUP(from);
                        len -= 3;
                    }
                    if (len) {
                        PUP(out) = PUP(from);
                        if (len > 1)
                            PUP(out) = PUP(from);
                    }
                }
                else {
                    from = out - dist;          /* copy direct from output */
                    do {                        /* minimum length is three */
                        PUP(out) = PUP(from);
                        PUP(out) = PUP(from);
                        PUP(out) = PUP(from);
                        len -= 3;
                    } while (len > 2);
                    if (len) {
                        PUP(out) = PUP(from);
                        if (len > 1)
                            PUP(out) = PUP(from);
                    }
                }
            }
            else if ((op & 64) == 0) {          /* 2nd level distance code */
                here = dcode[here.val + (hold & ((1U << op) - 1))];
                goto dodist;
            }
            else {
                strm->msg = (char *)"invalid distance code";
                state->mode = BAD;
                break;
            }
        }
        else if ((op & 64) == 0) {              /* 2nd level length code */
            here = lcode[here.val + (hold & ((1U << op) - 1))];
            goto dolen;
        }
        else if (op & 32) {                     /* end-of-block */
            Tracevv((stderr, "inflate:         end of block\n"));
            state->mode = TYPE;
            break;
        }
        else {
            strm->msg = (char *)"invalid literal/length code";
            state->mode = BAD;
            break;
        }
    } while (in < last && out < end);

    /* return unused bytes (on entry, bits < 8, so in won't go too far back) */
    len = bits >> 3;
    in -= len;
    bits -= len << 3;
    hold &= (1U << bits) - 1;

    /* update state and return */
    strm->next_in = in + OFF;
    strm->next_out = out + OFF;
    strm->avail_in = (unsigned)(in < last ? 5 + (last - in) : 5 - (in - last));
    strm->avail_out = (unsigned)(out < end ?
                                 257 + (end - out) : 257 - (out - end));
    state->hold = hold;
    state->bits = bits;
    return;
}